

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

bool jsonip::parser::
     seq_<jsonip::grammar::member_name,jsonip::grammar::spaces_,jsonip::parser::colon,jsonip::grammar::spaces_,jsonip::grammar::atom,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
     ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  pointer *ppSVar1;
  iterator __position;
  Reader *pRVar2;
  char *pcVar3;
  PositionType pcVar4;
  bool bVar5;
  pointer pSVar6;
  PositionType p;
  undefined1 auStack_20 [8];
  State cur_state;
  
  auStack_20 = (undefined1  [8])state->reader_->pos_;
  cur_state.pos_ = (PositionType)state->line_;
  __position._M_current =
       (state->stack_).
       super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (state->stack_).
      super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
    ::
    _M_realloc_insert<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State_const&>
              ((vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
                *)&state->stack_,__position,(State *)auStack_20);
  }
  else {
    (__position._M_current)->pos_ = (PositionType)auStack_20;
    (__position._M_current)->line_ = (size_t)cur_state.pos_;
    ppSVar1 = &(state->stack_).
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  bVar5 = semantic_rule<jsonip::grammar::member_name,jsonip::parser::string_>::
          match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>(state);
  if (bVar5) {
    bVar5 = star_<jsonip::grammar::space>::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>(state)
    ;
    if (bVar5) {
      pRVar2 = state->reader_;
      pcVar3 = pRVar2->pos_;
      if (((long)pcVar3 - (long)pRVar2->buf_ != pRVar2->len_) && (*pcVar3 == ':')) {
        pRVar2->pos_ = pcVar3 + 1;
        bVar5 = star_<jsonip::grammar::space>::
                match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                          (state);
        if (bVar5) {
          bVar5 = or_<jsonip::grammar::bool_,jsonip::grammar::double_,jsonip::grammar::string_rule,jsonip::grammar::array_,jsonip::grammar::object_,jsonip::grammar::null_,jsonip::parser::identity<false>,jsonip::parser::identity<false>>
                  ::
                  match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                            (state);
          goto LAB_0010d223;
        }
      }
    }
  }
  bVar5 = false;
LAB_0010d223:
  pcVar4 = state->reader_->pos_;
  if (bVar5 == false) {
    if (state->max_pos_ < pcVar4) {
      state->max_pos_ = pcVar4;
    }
    state->reader_->pos_ =
         (state->stack_).
         super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].pos_;
    pSVar6 = (state->stack_).
             super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    state->line_ = pSVar6[-1].line_;
  }
  else {
    if (state->max_pos_ < pcVar4) {
      state->max_pos_ = pcVar4;
    }
    pSVar6 = (state->stack_).
             super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  (state->stack_).
  super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar6 + -1;
  return bVar5;
}

Assistant:

static inline bool match(S& state)
        {
            state.push_state();

            bool var = C0::match(state) && C1::match(state) &&
                       C2::match(state) && C3::match(state) &&
                       C4::match(state) && C5::match(state) &&
                       C6::match(state) && C7::match(state);
            var ? state.commit() : state.rollback();

            return var;
        }